

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,void *value)

{
  error_handler local_21;
  void *local_20;
  void *value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  local_20 = value;
  value_local = this;
  if (this->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v7::detail::error_handler>(this->specs_->type,&local_21);
  }
  write_pointer(this,local_20);
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_) check_pointer_type_spec(specs_->type, error_handler());
    write_pointer(value);
    return out_;
  }